

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O0

void __thiscall ON_PointCloud::ON_PointCloud(ON_PointCloud *this,ON_PointCloud *src)

{
  ON_PointCloud *src_local;
  ON_PointCloud *this_local;
  
  ON_Geometry::ON_Geometry(&this->super_ON_Geometry);
  (this->super_ON_Geometry).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_00b767a8;
  ON_3dPointArray::ON_3dPointArray(&this->m_P);
  ON_SimpleArray<ON_3dVector>::ON_SimpleArray(&this->m_N);
  ON_SimpleArray<ON_Color>::ON_SimpleArray(&this->m_C);
  ON_SimpleArray<double>::ON_SimpleArray(&this->m_V);
  ON_SimpleArray<bool>::ON_SimpleArray(&this->m_H);
  this->m_hidden_count = 0;
  ON_Plane::ON_Plane(&this->m_plane);
  ON_BoundingBox::ON_BoundingBox(&this->m_bbox);
  this->m_flags = 0;
  operator=(this,src);
  return;
}

Assistant:

ON_PointCloud::ON_PointCloud( const ON_PointCloud& src )
{
  *this = src;
}